

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  average<double,_4UL> filter;
  average<double,_4UL> aStack_48;
  
  aStack_48.super_circular_array<double,_4UL>.super_circular_view<double,_4UL>.member.data =
       (pointer)&aStack_48;
  aStack_48.super_circular_array<double,_4UL>.super_circular_view<double,_4UL>.member.size = 0;
  aStack_48.super_circular_array<double,_4UL>.super_circular_view<double,_4UL>.member.next = 4;
  aStack_48.sum = 0.0;
  vista::circular::example::average<double,_4UL>::push(&aStack_48,11.0);
  if (aStack_48.super_circular_array<double,_4UL>.super_circular_view<double,_4UL>.member.size != 0)
  {
    auVar1._8_4_ = (int)(aStack_48.super_circular_array<double,_4UL>.
                         super_circular_view<double,_4UL>.member.size >> 0x20);
    auVar1._0_8_ = aStack_48.super_circular_array<double,_4UL>.super_circular_view<double,_4UL>.
                   member.size;
    auVar1._12_4_ = 0x45300000;
    dVar6 = aStack_48.sum /
            ((auVar1._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,
                              (int)aStack_48.super_circular_array<double,_4UL>.
                                   super_circular_view<double,_4UL>.member.size) -
            4503599627370496.0));
    if ((dVar6 != 11.0) || (NAN(dVar6))) {
      __assert_fail("filter.mean() == 11.0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/example/circular/average/main.cpp"
                    ,0x13,"int main()");
    }
    vista::circular::example::average<double,_4UL>::push(&aStack_48,22.0);
    if (aStack_48.super_circular_array<double,_4UL>.super_circular_view<double,_4UL>.member.size !=
        0) {
      auVar2._8_4_ = (int)(aStack_48.super_circular_array<double,_4UL>.
                           super_circular_view<double,_4UL>.member.size >> 0x20);
      auVar2._0_8_ = aStack_48.super_circular_array<double,_4UL>.super_circular_view<double,_4UL>.
                     member.size;
      auVar2._12_4_ = 0x45300000;
      dVar6 = aStack_48.sum /
              ((auVar2._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,
                                (int)aStack_48.super_circular_array<double,_4UL>.
                                     super_circular_view<double,_4UL>.member.size) -
              4503599627370496.0));
      if ((dVar6 != 16.5) || (NAN(dVar6))) {
        __assert_fail("filter.mean() == (11.0 + 22.0) / 2.0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/example/circular/average/main.cpp"
                      ,0x16,"int main()");
      }
      vista::circular::example::average<double,_4UL>::push(&aStack_48,33.0);
      if (aStack_48.super_circular_array<double,_4UL>.super_circular_view<double,_4UL>.member.size
          != 0) {
        auVar3._8_4_ = (int)(aStack_48.super_circular_array<double,_4UL>.
                             super_circular_view<double,_4UL>.member.size >> 0x20);
        auVar3._0_8_ = aStack_48.super_circular_array<double,_4UL>.super_circular_view<double,_4UL>.
                       member.size;
        auVar3._12_4_ = 0x45300000;
        dVar6 = aStack_48.sum /
                ((auVar3._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,
                                  (int)aStack_48.super_circular_array<double,_4UL>.
                                       super_circular_view<double,_4UL>.member.size) -
                4503599627370496.0));
        if ((dVar6 != 22.0) || (NAN(dVar6))) {
          __assert_fail("filter.mean() == (11.0 + 22.0 + 33.0) / 3.0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/example/circular/average/main.cpp"
                        ,0x19,"int main()");
        }
        vista::circular::example::average<double,_4UL>::push(&aStack_48,44.0);
        if (aStack_48.super_circular_array<double,_4UL>.super_circular_view<double,_4UL>.member.size
            != 0) {
          auVar4._8_4_ = (int)(aStack_48.super_circular_array<double,_4UL>.
                               super_circular_view<double,_4UL>.member.size >> 0x20);
          auVar4._0_8_ = aStack_48.super_circular_array<double,_4UL>.
                         super_circular_view<double,_4UL>.member.size;
          auVar4._12_4_ = 0x45300000;
          dVar6 = aStack_48.sum /
                  ((auVar4._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,
                                    (int)aStack_48.super_circular_array<double,_4UL>.
                                         super_circular_view<double,_4UL>.member.size) -
                  4503599627370496.0));
          if ((dVar6 != 27.5) || (NAN(dVar6))) {
            __assert_fail("filter.mean() == (11.0 + 22.0 + 33.0 + 44.0) / 4.0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/example/circular/average/main.cpp"
                          ,0x1c,"int main()");
          }
          vista::circular::example::average<double,_4UL>::push(&aStack_48,55.0);
          if (aStack_48.super_circular_array<double,_4UL>.super_circular_view<double,_4UL>.member.
              size != 0) {
            auVar5._8_4_ = (int)(aStack_48.super_circular_array<double,_4UL>.
                                 super_circular_view<double,_4UL>.member.size >> 0x20);
            auVar5._0_8_ = aStack_48.super_circular_array<double,_4UL>.
                           super_circular_view<double,_4UL>.member.size;
            auVar5._12_4_ = 0x45300000;
            dVar6 = aStack_48.sum /
                    ((auVar5._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,
                                      (int)aStack_48.super_circular_array<double,_4UL>.
                                           super_circular_view<double,_4UL>.member.size) -
                    4503599627370496.0));
            if ((dVar6 == 38.5) && (!NAN(dVar6))) {
              return 0;
            }
            __assert_fail("filter.mean() == (22.0 + 33.0 + 44.0 + 55.0) / 4.0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/example/circular/average/main.cpp"
                          ,0x1f,"int main()");
          }
        }
      }
    }
  }
  __assert_fail("!empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/example/circular/average/average.hpp"
                ,0x41,
                "value_type vista::circular::example::average<double, 4>::mean() const [T = double, N = 4]"
               );
}

Assistant:

int main()
{
    vista::circular::example::average<double, 4> filter;

    filter.push(11.0);
    assert(filter.mean() == 11.0);

    filter.push(22.0);
    assert(filter.mean() == (11.0 + 22.0) / 2.0);

    filter.push(33.0);
    assert(filter.mean() == (11.0 + 22.0 + 33.0) / 3.0);

    filter.push(44.0);
    assert(filter.mean() == (11.0 + 22.0 + 33.0 + 44.0) / 4.0);

    filter.push(55.0);
    assert(filter.mean() == (22.0 + 33.0 + 44.0 + 55.0) / 4.0);

    return 0;
}